

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_common.cpp
# Opt level: O0

RK_S32 mpp_log2_16bit(RK_U32 v)

{
  int local_10;
  uint local_c;
  RK_S32 n;
  RK_U32 v_local;
  
  local_10 = 0;
  local_c = v;
  if ((v & 0xff00) != 0) {
    local_c = v >> 8;
    local_10 = 8;
  }
  return (uint)""[local_c] + local_10;
}

Assistant:

RK_S32 mpp_log2_16bit(RK_U32 v)
{
    RK_S32 n = 0;
    if (v & 0xff00) {
        v >>= 8;
        n += 8;
    }
    n += log2_tab[v];

    return n;
}